

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FMultiBlockLinesIterator::FMultiBlockLinesIterator
          (FMultiBlockLinesIterator *this,FPortalGroupArray *check,double checkx,double checky,
          double checkz,double checkh,double checkradius,sector_t *newsec)

{
  TVector3<double> local_60;
  sector_t_conflict *local_48;
  sector_t *newsec_local;
  double checkradius_local;
  double checkh_local;
  double checkz_local;
  double checky_local;
  double checkx_local;
  FPortalGroupArray *check_local;
  FMultiBlockLinesIterator *this_local;
  
  this->checklist = check;
  local_48 = (sector_t_conflict *)newsec;
  newsec_local = (sector_t *)checkradius;
  checkradius_local = checkh;
  checkh_local = checkz;
  checkz_local = checky;
  checky_local = checkx;
  checkx_local = (double)check;
  check_local = (FPortalGroupArray *)this;
  TVector3<double>::TVector3(&this->checkpoint);
  TVector2<double>::TVector2(&this->offset);
  FBlockLinesIterator::FBlockLinesIterator(&this->blockIterator);
  FBoundingBox::FBoundingBox(&this->bbox);
  TVector3<double>::TVector3(&local_60,checky_local,checkz_local,checkh_local);
  TVector3<double>::operator=(&this->checkpoint,&local_60);
  if (local_48 == (sector_t_conflict *)0x0) {
    local_48 = P_PointInSector(checky_local,checkz_local);
  }
  this->startsector = (sector_t *)local_48;
  this->basegroup = (short)local_48->PortalGroup;
  if ((*(byte *)checkx_local & 1) == 0) {
    P_CollectConnectedGroups
              ((int)this->basegroup,&this->checkpoint,checkh_local + checkradius_local,
               (double)newsec_local,this->checklist);
  }
  (this->checkpoint).Z = (double)newsec_local;
  Reset(this);
  return;
}

Assistant:

FMultiBlockLinesIterator::FMultiBlockLinesIterator(FPortalGroupArray &check, double checkx, double checky, double checkz, double checkh, double checkradius, sector_t *newsec)
	: checklist(check)
{
	checkpoint = { checkx, checky, checkz };
	if (newsec == NULL)	newsec = P_PointInSector(checkx, checky);
	startsector = newsec;
	basegroup = newsec->PortalGroup;
	if (!check.inited) P_CollectConnectedGroups(basegroup, checkpoint, checkz + checkh, checkradius, checklist);
	checkpoint.Z = checkradius;
	Reset();
}